

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O1

Data2D<double> *
readMatrixFromOpen<TasGrid::IO::mode_binary_type>
          (Data2D<double> *__return_storage_ptr__,istream *is)

{
  unsigned_long in_RCX;
  size_t sVar1;
  size_t sVar2;
  int v;
  vector<double,_std::allocator<double>_> local_48;
  
  std::istream::read((char *)is,(long)&local_48);
  sVar1 = (size_t)(int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
  std::istream::read((char *)is,(long)&local_48);
  sVar2 = (size_t)(int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
  TasGrid::IO::readVector<TasGrid::IO::mode_binary_type,double,unsigned_long>
            (&local_48,(IO *)is,(istream *)(sVar2 * sVar1),in_RCX);
  __return_storage_ptr__->stride = sVar2;
  __return_storage_ptr__->num_strips = sVar1;
  (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
  (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

Data2D<double> readMatrixFromOpen(std::istream &is){
    int rows = IO::readNumber<iomode, int>(is);
    int cols = IO::readNumber<iomode, int>(is);
    return Data2D<double>(cols, rows, IO::readVector<iomode, double>(is, Utils::size_mult(cols, rows)));
}